

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O2

void PUT_64BIT_LSB_FIRST(void *vp,uint64_t value)

{
  *(uint64_t *)vp = value;
  return;
}

Assistant:

static inline void PUT_64BIT_LSB_FIRST(void *vp, uint64_t value)
{
    uint8_t *p = (uint8_t *)vp;
    p[0] = (uint8_t)(value);
    p[1] = (uint8_t)(value >> 8);
    p[2] = (uint8_t)(value >> 16);
    p[3] = (uint8_t)(value >> 24);
    p[4] = (uint8_t)(value >> 32);
    p[5] = (uint8_t)(value >> 40);
    p[6] = (uint8_t)(value >> 48);
    p[7] = (uint8_t)(value >> 56);
}